

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

bool TldAddressAsKey::CompareByAddressAndTld(TldAddressAsKey *x,TldAddressAsKey *y)

{
  int iVar1;
  size_t local_28;
  size_t tld_len;
  int r;
  bool ret;
  TldAddressAsKey *y_local;
  TldAddressAsKey *x_local;
  
  tld_len._7_1_ = y->addr_len < x->addr_len;
  if (x->addr_len == y->addr_len) {
    iVar1 = memcmp(x->addr,y->addr,x->addr_len);
    if (iVar1 < 1) {
      if (iVar1 == 0) {
        local_28 = x->tld_len;
        if (y->tld_len < x->tld_len) {
          local_28 = y->tld_len;
        }
        iVar1 = memcmp(x->tld,y->tld,local_28);
        if (iVar1 < 1) {
          if (iVar1 == 0) {
            tld_len._7_1_ = y->tld_len < x->tld_len;
          }
        }
        else {
          tld_len._7_1_ = true;
        }
      }
    }
    else {
      tld_len._7_1_ = true;
    }
  }
  return tld_len._7_1_;
}

Assistant:

bool TldAddressAsKey::CompareByAddressAndTld(TldAddressAsKey * x, TldAddressAsKey * y)
{
    bool ret = x->addr_len > y->addr_len;

    if (x->addr_len == y->addr_len)
    {
        int r = memcmp(x->addr, y->addr, x->addr_len);

        if (r > 0) {
            ret = true;
        }
        else if (r == 0) {
            size_t tld_len = x->tld_len;
            if (y->tld_len < x->tld_len) {
                tld_len = y->tld_len;
            }
            r = memcmp(x->tld, y->tld, tld_len);
            if (r > 0) {
                ret = true;
            }
            else if (r == 0) {
                ret = x->tld_len > y->tld_len;
            }
        }
    }

    return ret;
}